

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::checkRemoveCommandBufferInfo(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  cl_int cVar1;
  iterator __position;
  CLdispatchX *pCVar2;
  iterator __position_00;
  _Base_ptr p_Var3;
  iterator __end5;
  cl_uint refCount;
  cl_command_buffer_khr cmdbuf_local;
  _Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
  *local_58;
  _cl_mutable_command_khr *cmd;
  
  cmdbuf_local = cmdbuf;
  std::mutex::lock(&this->m_Mutex);
  __position = std::
               _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
               ::find(&(this->m_CommandBufferInfoMap)._M_t,&cmdbuf_local);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = __position._M_node[1]._M_parent;
    pCVar2 = dispatchX(this,(cl_platform_id)p_Var3);
    if (pCVar2->clGetCommandBufferInfoKHR ==
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      std::__cxx11::string::string
                ((string *)&cmd,"clGetCommandBufferInfoKHR",(allocator *)&refCount);
      getExtensionFunctionAddress(this,(cl_platform_id)p_Var3,(string *)&cmd);
      std::__cxx11::string::~string((string *)&cmd);
    }
    pCVar2 = dispatchX(this,(cl_platform_id)p_Var3);
    if (pCVar2->clGetCommandBufferInfoKHR !=
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      refCount = 0;
      cVar1 = (*pCVar2->clGetCommandBufferInfoKHR)(cmdbuf_local,0x1296,4,&refCount,(size_t *)0x0);
      if ((cVar1 == 0) && (refCount == 1)) {
        std::
        _Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>>
        ::erase_abi_cxx11_((_Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>>
                            *)&this->m_CommandBufferInfoMap,__position);
        std::
        _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
        ::erase(&(this->m_CommandBufferRecordMap)._M_t,&cmdbuf_local);
        __position_00 =
             std::
             _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
             ::find(&(this->m_CommandBufferMutableCommandsMap)._M_t,&cmdbuf_local);
        if ((_Rb_tree_header *)__position_00._M_node !=
            &(this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header) {
          p_Var3 = (_Base_ptr)&__position_00._M_node[1]._M_parent;
          local_58 = (_Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
                      *)&this->m_CommandBufferMutableCommandsMap;
          while (p_Var3 = *(_Base_ptr *)p_Var3,
                p_Var3 != (_Base_ptr)&__position_00._M_node[1]._M_parent) {
            cmd = (_cl_mutable_command_khr *)p_Var3->_M_left;
            std::
            _Rb_tree<_cl_mutable_command_khr_*,_std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>,_std::_Select1st<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
            ::erase(&(this->m_MutableCommandInfoMap)._M_t,&cmd);
          }
          std::
          _Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
          ::erase_abi_cxx11_(local_58,__position_00);
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveCommandBufferInfo(
    cl_command_buffer_khr cmdbuf)
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;
            errorCode = dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_REFERENCE_COUNT_KHR,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_CommandBufferInfoMap.erase( iter );
                m_CommandBufferRecordMap.erase( cmdbuf );

                CCommandBufferMutableCommandsMap::iterator cmditer =
                    m_CommandBufferMutableCommandsMap.find( cmdbuf );
                if( cmditer != m_CommandBufferMutableCommandsMap.end() )
                {
                    CMutableCommandList&    cmdList = cmditer->second;
                    for( auto cmd : cmdList )
                    {
                        m_MutableCommandInfoMap.erase(cmd);
                    }

                    m_CommandBufferMutableCommandsMap.erase(cmditer);
                }
            }
        }
    }
}